

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

Value * duckdb::TableMacroExtractor::GetParameterTypes
                  (Value *__return_storage_ptr__,TableMacroCatalogEntry *entry,idx_t offset)

{
  reference this;
  type pMVar1;
  ulong uVar2;
  vector<duckdb::Value,_true> results;
  pointer local_78;
  pointer pVStack_70;
  pointer local_68;
  LogicalType local_60;
  vector<duckdb::Value,_true> local_48;
  
  local_78 = (pointer)0x0;
  pVStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  this = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
         ::operator[](&(entry->super_MacroCatalogEntry).macros,offset);
  pMVar1 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
           operator*(this);
  if ((pMVar1->parameters).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pMVar1->parameters).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_78,
                 &LogicalType::VARCHAR);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(pMVar1->parameters).
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pMVar1->parameters).
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((pMVar1->default_parameters)._M_h._M_element_count != 0) {
    uVar2 = 0;
    do {
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_78,
                 &LogicalType::VARCHAR);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (pMVar1->default_parameters)._M_h._M_element_count);
  }
  LogicalType::LogicalType(&local_60,VARCHAR);
  local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_78;
  local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_70;
  local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_68;
  local_78 = (pointer)0x0;
  pVStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  Value::LIST(__return_storage_ptr__,&local_60,&local_48);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
  LogicalType::~LogicalType(&local_60);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

static Value GetParameterTypes(TableMacroCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		auto &macro_entry = *entry.macros[offset];
		for (idx_t i = 0; i < macro_entry.parameters.size(); i++) {
			results.emplace_back(LogicalType::VARCHAR);
		}
		for (idx_t i = 0; i < macro_entry.default_parameters.size(); i++) {
			results.emplace_back(LogicalType::VARCHAR);
		}
		return Value::LIST(LogicalType::VARCHAR, std::move(results));
	}